

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O1

BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)66,_(mp::expr::Kind)67>_>
 __thiscall
mp::BasicExprFactory<std::allocator<char>>::
BeginIterated<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)66,(mp::expr::Kind)67>>
          (BasicExprFactory<std::allocator<char>> *this,Kind kind,int num_args)

{
  uint uVar1;
  uint uVar2;
  AssertionFailure *this_00;
  undefined8 *puVar3;
  BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)66,_(mp::expr::Kind)67>_>
  BVar4;
  
  if (num_args < 0) {
    this_00 = (AssertionFailure *)__cxa_allocate_exception(0x10);
    AssertionFailure::AssertionFailure(this_00,"invalid number of arguments");
    __cxa_throw(this_00,&AssertionFailure::typeinfo,std::logic_error::~logic_error);
  }
  uVar1 = num_args - 1;
  uVar2 = -uVar1;
  if (0 < (int)uVar1) {
    uVar2 = uVar1;
  }
  if (uVar2 < 0x10000000) {
    BVar4.impl_ = Allocate<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)66,(mp::expr::Kind)67>>
                            (this,kind,uVar1 * 8);
    (BVar4.impl_)->num_args = num_args;
    BVar4._8_8_ = 0;
    return BVar4;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = &PTR__exception_0019d8e0;
  __cxa_throw(puVar3,&OverflowError::typeinfo,std::exception::~exception);
}

Assistant:

BasicIteratedExprBuilder<ExprType> BeginIterated(
        expr::Kind kind, int num_args) {
    MP_ASSERT(num_args >= 0, "invalid number of arguments");
    SafeInt<int> size = sizeof(Expr::Impl*);
    typename ExprType::Impl *impl =
        Allocate<ExprType>(kind, val(size * (num_args - 1)));
    impl->num_args = num_args;
    return BasicIteratedExprBuilder<ExprType>(impl);
  }